

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O2

ConversionResult
convertUTF::ConvertUTF8toUTF32
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  ConversionResult CVar4;
  Boolean BVar5;
  int iVar6;
  uint uVar7;
  ConversionResult CVar8;
  uint uVar9;
  ConversionResult CVar10;
  uint *puVar11;
  ulong uVar12;
  byte *source;
  bool bVar13;
  
  source = *sourceStart;
  puVar11 = *targetStart;
  CVar8 = conversionOK;
  do {
    CVar10 = CVar8;
    if (sourceEnd <= source) {
LAB_00196f62:
      *sourceStart = source;
      *targetStart = puVar11;
      return CVar10;
    }
    bVar2 = *source;
    uVar9 = (uint)bVar2;
    bVar3 = trailingBytesForUTF8[bVar2];
    uVar12 = (ulong)bVar3;
    if (sourceEnd <= source + uVar12) {
      CVar10 = sourceExhausted;
      goto LAB_00196f62;
    }
    lVar1 = uVar12 + 1;
    BVar5 = anon_unknown_11::isLegalUTF8(source,(int)lVar1);
    CVar10 = sourceIllegal;
    if (!BVar5) goto LAB_00196f62;
    iVar6 = 0;
    switch(uVar12) {
    case 0:
      uVar7 = (uint)bVar3;
      break;
    case 5:
      iVar6 = (uint)bVar2 << 6;
      uVar9 = (uint)source[1];
      source = source + 1;
    case 4:
      iVar6 = (uVar9 + iVar6) * 0x40;
      uVar9 = (uint)source[1];
      source = source + 1;
    case 3:
      iVar6 = (uVar9 + iVar6) * 0x40;
      uVar9 = (uint)source[1];
      source = source + 1;
    case 2:
      iVar6 = (uVar9 + iVar6) * 0x40;
      uVar9 = (uint)source[1];
      source = source + 1;
    case 1:
      uVar7 = (uVar9 + iVar6) * 0x40;
      uVar9 = (uint)source[1];
      source = source + 1;
      break;
    default:
      goto switchD_00196e96_default;
    }
    source = source + 1;
    iVar6 = uVar9 + uVar7;
switchD_00196e96_default:
    if (targetEnd <= puVar11) {
      source = source + -lVar1;
      CVar10 = targetExhausted;
      goto LAB_00196f62;
    }
    uVar7 = iVar6 - *(int *)(offsetsFromUTF8 + uVar12 * 4);
    uVar9 = 0xfffd;
    CVar4 = sourceIllegal;
    if (uVar7 < 0x110000) {
      bVar13 = (uVar7 & 0x1ff800) == 0xd800;
      if (bVar13) {
        uVar7 = 0xfffd;
      }
      uVar9 = uVar7;
      CVar4 = CVar8;
      if (bVar13 && flags == strictConversion) {
        source = source + -lVar1;
        goto LAB_00196f62;
      }
    }
    CVar8 = CVar4;
    *puVar11 = uVar9;
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

ConversionResult ConvertUTF8toUTF32(const UTF8** sourceStart, const UTF8* sourceEnd, UTF32** targetStart,
                                    const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF8* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        UTF32 ch = 0;
        const uint8_t extraBytesToRead = trailingBytesForUTF8[*source];
        if (source + extraBytesToRead >= sourceEnd)
        {
            result = ConversionResult::sourceExhausted;
            break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead + 1))
        {
            result = ConversionResult::sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead)
        {
        case 5:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 4:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 3:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 2:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 1:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 0:
            ch += *source++;
            break;
        default:;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd)
        {
            source -= (extraBytesToRead + 1); /* Back up the source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        if (ch <= UNI_MAX_LEGAL_UTF32)
        {
            /*
             * UTF-16 surrogate values are illegal in UTF-32, and anything
             * over Plane 17 (> 0x10FFFF) is illegal.
             */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    source -= (extraBytesToRead + 1); /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = ch;
            }
        }
        else
        { /* i.e., ch > UNI_MAX_LEGAL_UTF32 */
            result = ConversionResult::sourceIllegal;
            *target++ = UNI_REPLACEMENT_CHAR;
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}